

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_utils.hpp
# Opt level: O2

void __thiscall
ELFIO::elf_header_impl<ELFIO::Elf64_Ehdr>::set_sections_num
          (elf_header_impl<ELFIO::Elf64_Ehdr> *this,Elf_Half value)

{
  ushort uVar1;
  
  uVar1 = value << 8 | value >> 8;
  if ((this->convertor).need_conversion == false) {
    uVar1 = value;
  }
  (this->header).e_shnum = uVar1;
  return;
}

Assistant:

uint16_t
    operator()( uint16_t value ) const
    {
        if ( !need_conversion ) {
            return value;
        }
        value =
            ( ( value & 0x00FF ) <<  8 ) |
            ( ( value & 0xFF00 ) >>  8 );

        return value;
    }